

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int64_t floatx80_to_int64_arm(floatx80 a,float_status *status)

{
  int64_t iVar1;
  ushort uVar2;
  uint64_t aSig;
  uint64_t aSigExtra;
  uint64_t local_30;
  uint64_t local_28;
  
  local_30 = a.low;
  uVar2 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 &&
      -1 < (long)local_30) {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -0x8000000000000000;
  }
  if (uVar2 < 0x403e) {
    shift64ExtraRightJamming(local_30,0,0x403e - (uint)uVar2,&local_30,&local_28);
  }
  else {
    if (uVar2 != 0x403e) {
      status->float_exception_flags = status->float_exception_flags | 1;
      if (-1 < (short)a.high) {
        return 0x7fffffffffffffff;
      }
      iVar1 = 0x7fffffffffffffff;
      if (uVar2 != 0x7fff) {
        iVar1 = -0x8000000000000000;
      }
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
        return iVar1;
      }
      return -0x8000000000000000;
    }
    local_28 = 0;
  }
  iVar1 = roundAndPackInt64((flag)((a._8_8_ & 0xffff) >> 0xf),local_30,local_28,status);
  return iVar1;
}

Assistant:

int64_t floatx80_to_int64(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig, aSigExtra;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return 1ULL << 63;
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    shiftCount = 0x403E - aExp;
    if ( shiftCount <= 0 ) {
        if ( shiftCount ) {
            float_raise(float_flag_invalid, status);
            if (!aSign || floatx80_is_any_nan(a)) {
                return INT64_MAX;
            }
            return INT64_MIN;
        }
        aSigExtra = 0;
    }
    else {
        shift64ExtraRightJamming( aSig, 0, shiftCount, &aSig, &aSigExtra );
    }
    return roundAndPackInt64(aSign, aSig, aSigExtra, status);

}